

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

Error __thiscall asmjit::BaseEmitter::commentv(BaseEmitter *this,char *fmt,__va_list_tag *ap)

{
  ErrorHandler *pEVar1;
  Error _err;
  Error EVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  StringTmp<1024UL> sb;
  anon_union_32_4_a21e1b61_for_String_0 local_448;
  char local_428 [1040];
  
  if ((this->_emitterFlags & 8) == 0) {
    EVar2 = 0;
    if ((this->_emitterFlags & 1) == 0) {
      pEVar1 = this->_errorHandler;
      EVar2 = 5;
      if (pEVar1 != (ErrorHandler *)0x0) {
        pcVar3 = DebugUtils::errorAsString(5);
        (*pEVar1->_vptr_ErrorHandler[2])(pEVar1,5,pcVar3,this);
      }
    }
  }
  else {
    local_448._large.data = local_428;
    local_448._large.size = 0;
    local_448._0_8_ = 0x20;
    local_448._large.capacity = 0x407;
    local_428[0] = '\0';
    EVar2 = String::_opVFormat((String *)&local_448._small,1,fmt,ap);
    if (EVar2 == 0) {
      uVar4 = local_448._large.size;
      uVar5 = local_448._large.data;
      if ((local_448._0_8_ & 0xff) < 0x1f) {
        uVar4 = local_448._0_8_ & 0xff;
        uVar5 = local_448._small.data;
      }
      EVar2 = (*this->_vptr_BaseEmitter[0xf])(this,uVar5,uVar4);
    }
    String::reset((String *)&local_448._small);
  }
  return EVar2;
}

Assistant:

Error BaseEmitter::commentv(const char* fmt, va_list ap) {
  if (!hasEmitterFlag(kFlagLogComments)) {
    if (!hasEmitterFlag(kFlagAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;
  Error err = sb.appendVFormat(fmt, ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt, ap);
  return kErrorOk;
#endif
}